

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O0

void __thiscall
cmGeneratedFileStream::~cmGeneratedFileStream(cmGeneratedFileStream *this,void **vtt)

{
  bool bVar1;
  void **vtt_local;
  cmGeneratedFileStream *this_local;
  
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream +
            (long)(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                  _vptr_basic_ostream[-3]) = vtt[5];
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)&(this->super_ofstream).
                                    super_basic_ostream<char,_std::char_traits<char>_>.
                                    _vptr_basic_ostream +
                            (long)(this->super_ofstream).
                                  super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream[-3]));
  (this->super_ofstream).field_0x139 = -bVar1 & 1;
  std::ofstream::~ofstream(this);
  cmGeneratedFileStreamBase::~cmGeneratedFileStreamBase
            ((cmGeneratedFileStreamBase *)
             &(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  return;
}

Assistant:

cmGeneratedFileStream::~cmGeneratedFileStream()
{
  // This is the first destructor called.  Check the status of the
  // stream and give the information to the private base.  Next the
  // stream will be destroyed which will close the temporary file.
  // Finally the base destructor will be called to replace the
  // destination file.
  this->Okay = (*this)?true:false;
}